

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O0

bool __thiscall re2::Backtracker::Visit(Backtracker *this,int id,char *p)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator pcVar5;
  ostream *poVar6;
  Inst *this_00;
  Inst *ip;
  char *local_1c0;
  size_t n;
  LogMessage local_1a8;
  char *local_28;
  char *p_local;
  Backtracker *pBStack_18;
  int id_local;
  Backtracker *this_local;
  
  local_28 = p;
  p_local._4_4_ = id;
  pBStack_18 = this;
  pcVar5 = StringPiece::end(&this->text_);
  if (pcVar5 < p) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0x9c);
    poVar6 = LogMessage::stream(&local_1a8);
    std::operator<<(poVar6,"Check failed: p <= text_.end()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
  }
  iVar4 = p_local._4_4_;
  iVar3 = StringPiece::size(&this->text_);
  pcVar1 = local_28;
  pcVar5 = StringPiece::begin(&this->text_);
  local_1c0 = pcVar1 + ((long)(iVar4 * (iVar3 + 1)) - (long)pcVar5);
  if (this->nvisited_ <= (ulong)local_1c0 >> 5) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&ip,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0x9e);
    poVar6 = LogMessage::stream((LogMessage *)&ip);
    std::operator<<(poVar6,"Check failed: (n/32) < (nvisited_)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ip);
  }
  if ((this->visited_[(ulong)local_1c0 >> 5] & 1 << ((byte)local_1c0 & 0x1f)) == 0) {
    this->visited_[(ulong)local_1c0 >> 5] =
         1 << ((byte)local_1c0 & 0x1f) | this->visited_[(ulong)local_1c0 >> 5];
    this_00 = Prog::inst(this->prog_,p_local._4_4_);
    bVar2 = Try(this,p_local._4_4_,local_28);
    if (bVar2) {
      if (((this->longest_ & 1U) != 0) && (iVar4 = Prog::Inst::last(this_00), iVar4 == 0)) {
        Visit(this,p_local._4_4_ + 1,local_28);
      }
      this_local._7_1_ = true;
    }
    else {
      iVar4 = Prog::Inst::last(this_00);
      if (iVar4 == 0) {
        this_local._7_1_ = Visit(this,p_local._4_4_ + 1,local_28);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Backtracker::Visit(int id, const char* p) {
  // Check bitmap.  If we've already explored from here,
  // either it didn't match or it did but we're hoping for a better match.
  // Either way, don't go down that road again.
  CHECK(p <= text_.end());
  size_t n = id*(text_.size()+1) + (p - text_.begin());
  CHECK_LT(n/32, nvisited_);
  if (visited_[n/32] & (1 << (n&31)))
    return false;
  visited_[n/32] |= 1 << (n&31);

  Prog::Inst* ip = prog_->inst(id);
  if (Try(id, p)) {
    if (longest_ && !ip->last())
      Visit(id+1, p);
    return true;
  }
  if (!ip->last())
    return Visit(id+1, p);
  return false;
}